

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopl_file.c
# Opt level: O1

int WOPL_SaveInstToMem(WOPIFile *file,void *dest_mem,size_t length,uint16_t version)

{
  uint16_t version_00;
  int iVar1;
  
  if (dest_mem == (void *)0x0) {
    iVar1 = 6;
  }
  else {
    version_00 = 3;
    if (version != 0) {
      version_00 = version;
    }
    iVar1 = 2;
    if (10 < length) {
      *(undefined8 *)dest_mem = 0x4e492d334c504f57;
      *(undefined4 *)((long)dest_mem + 7) = 0x54534e;
      if (((1 < length - 0xb) && (*(uint16_t *)((long)dest_mem + 0xb) = version_00, length != 0xd))
         && (*(uint8_t *)((long)dest_mem + 0xd) = file->is_drum, 0x3d < length - 0xe)) {
        iVar1 = 0;
        WOPL_writeInstrument(&file->inst,(uint8_t *)((long)dest_mem + 0xe),version_00,'\0');
      }
    }
  }
  return iVar1;
}

Assistant:

int WOPL_SaveInstToMem(WOPIFile *file, void *dest_mem, size_t length, uint16_t version)
{
    uint8_t *cursor = (uint8_t *)dest_mem;
    uint16_t ins_size;

    if(!cursor)
        return WOPL_ERR_NULL_POINTER;

    if(version == 0)
        version = wopl_latest_version;

#define GO_FORWARD(bytes) { cursor += bytes; length -= bytes; }

    {/* Magic number */
        if(length < 11)
            return WOPL_ERR_UNEXPECTED_ENDING;
        memcpy(cursor, wopli_magic, 11);
        GO_FORWARD(11);
    }

    {/* Version code */
        if(length < 2)
            return WOPL_ERR_UNEXPECTED_ENDING;
        fromUint16LE(version, cursor);
        GO_FORWARD(2);
    }

    {/* is drum flag */
        if(length < 1)
            return WOPL_ERR_UNEXPECTED_ENDING;
        *cursor = file->is_drum;
        GO_FORWARD(1);
    }

    if(version > 2)
        /* Skip sounding delays are not part of single-instrument file
         * two sizes of uint16_t will be subtracted */
        ins_size = WOPL_INST_SIZE_V3 - (sizeof(uint16_t) * 2);
    else
        ins_size = WOPL_INST_SIZE_V2;

    if(length < ins_size)
        return WOPL_ERR_UNEXPECTED_ENDING;

    WOPL_writeInstrument(&file->inst, cursor, version, 0);
    GO_FORWARD(ins_size);

    return WOPL_ERR_OK;
#undef GO_FORWARD
}